

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O0

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,ReturnNode *node)

{
  bool bVar1;
  ExpressionNode *pEVar2;
  reference pvVar3;
  undefined8 in_RDI;
  TypeChecker typeChecker;
  SymbolTable *in_stack_ffffffffffffff78;
  TypeName type;
  TypeChecker *in_stack_ffffffffffffff80;
  undefined8 local_4c;
  undefined4 local_44;
  undefined8 local_40;
  undefined4 local_38;
  TypeChecker local_28;
  
  pEVar2 = ReturnNode::getValue((ReturnNode *)0x17c3db);
  (*(pEVar2->super_Node)._vptr_Node[2])(pEVar2,in_RDI);
  TypeChecker::TypeChecker(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  type = (TypeName)((ulong)in_stack_ffffffffffffff78 >> 0x38);
  pEVar2 = ReturnNode::getValue((ReturnNode *)0x17c409);
  (*(pEVar2->super_Node)._vptr_Node[2])(pEVar2,&local_28);
  TypeChecker::getType(&local_28);
  bVar1 = std::optional<TypeName>::has_value((optional<TypeName> *)0x17c440);
  if (bVar1) {
    TypeChecker::getType(&local_28);
    std::optional<TypeName>::value((optional<TypeName> *)in_stack_ffffffffffffff80);
    ReturnInfo::ReturnInfo((ReturnInfo *)in_stack_ffffffffffffff80,type);
    pvVar3 = std::
             stack<SemanticAnalyser::ReturnInfo,_std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>_>
             ::top((stack<SemanticAnalyser::ReturnInfo,_std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>_>
                    *)0x17c489);
    pvVar3->hasReturn = (bool)(undefined1)local_40;
    *(undefined3 *)&pvVar3->field_0x1 = local_40._1_3_;
    (pvVar3->type).super__Optional_base<TypeName,_true,_true>._M_payload.
    super__Optional_payload_base<TypeName>._M_payload = (_Storage<TypeName,_true>)local_40._4_4_;
    *(undefined4 *)
     &(pvVar3->type).super__Optional_base<TypeName,_true,_true>._M_payload.
      super__Optional_payload_base<TypeName>._M_engaged = local_38;
  }
  else {
    ReturnInfo::ReturnInfo((ReturnInfo *)in_stack_ffffffffffffff80,SUB41(type >> 0x18,0));
    pvVar3 = std::
             stack<SemanticAnalyser::ReturnInfo,_std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>_>
             ::top((stack<SemanticAnalyser::ReturnInfo,_std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>_>
                    *)0x17c4df);
    pvVar3->hasReturn = (bool)(undefined1)local_4c;
    *(undefined3 *)&pvVar3->field_0x1 = local_4c._1_3_;
    (pvVar3->type).super__Optional_base<TypeName,_true,_true>._M_payload.
    super__Optional_payload_base<TypeName>._M_payload = (_Storage<TypeName,_true>)local_4c._4_4_;
    *(undefined4 *)
     &(pvVar3->type).super__Optional_base<TypeName,_true,_true>._M_payload.
      super__Optional_payload_base<TypeName>._M_engaged = local_44;
  }
  TypeChecker::~TypeChecker((TypeChecker *)0x17c502);
  return;
}

Assistant:

void SemanticAnalyser::visit(const ReturnNode& node) 
{
  node.getValue().accept(*this);
  TypeChecker typeChecker{symbols_};
  node.getValue().accept(typeChecker);

  if(typeChecker.getType().has_value())
    hasReturn_.top() = ReturnInfo{typeChecker.getType().value()};
  else
    hasReturn_.top() = ReturnInfo{true};
}